

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::time_internal::cctz::time_zone::name_abi_cxx11_
          (string *__return_storage_ptr__,time_zone *this)

{
  pointer pcVar1;
  time_zone tVar2;
  
  tVar2 = (time_zone)this->impl_;
  if (tVar2.impl_ == (Impl *)0x0) {
    tVar2 = Impl::UTC();
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = ((tVar2.impl_)->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + ((tVar2.impl_)->name_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string time_zone::name() const { return effective_impl().Name(); }